

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4menc.c
# Opt level: O0

char * colorspace(uint bit_depth,aom_chroma_sample_position_t csp,aom_img_fmt_t fmt)

{
  aom_img_fmt_t in_EDX;
  aom_chroma_sample_position_t in_ESI;
  undefined4 in_EDI;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_8;
  
  switch(in_EDI) {
  case 8:
    local_8 = colorspace8(in_ESI,in_EDX);
    break;
  case 9:
    if (in_EDX == AOM_IMG_FMT_I44416) {
      local_28 = "C444p9 XYSCSS=444P9";
    }
    else {
      local_28 = "C420p9 XYSCSS=420P9";
      if (in_EDX == AOM_IMG_FMT_I42216) {
        local_28 = "C422p9 XYSCSS=422P9";
      }
    }
    local_8 = local_28;
    break;
  case 10:
    if (in_EDX == AOM_IMG_FMT_I44416) {
      local_30 = "C444p10 XYSCSS=444P10";
    }
    else {
      local_30 = "C420p10 XYSCSS=420P10";
      if (in_EDX == AOM_IMG_FMT_I42216) {
        local_30 = "C422p10 XYSCSS=422P10";
      }
    }
    local_8 = local_30;
    break;
  default:
    local_8 = (char *)0x0;
    break;
  case 0xc:
    if (in_EDX == AOM_IMG_FMT_I44416) {
      local_38 = "C444p12 XYSCSS=444P12";
    }
    else {
      local_38 = "C420p12 XYSCSS=420P12";
      if (in_EDX == AOM_IMG_FMT_I42216) {
        local_38 = "C422p12 XYSCSS=422P12";
      }
    }
    local_8 = local_38;
    break;
  case 0xe:
    if (in_EDX == AOM_IMG_FMT_I44416) {
      local_40 = "C444p14 XYSCSS=444P14";
    }
    else {
      local_40 = "C420p14 XYSCSS=420P14";
      if (in_EDX == AOM_IMG_FMT_I42216) {
        local_40 = "C422p14 XYSCSS=422P14";
      }
    }
    local_8 = local_40;
    break;
  case 0x10:
    if (in_EDX == AOM_IMG_FMT_I44416) {
      local_48 = "C444p16 XYSCSS=444P16";
    }
    else {
      local_48 = "C420p16 XYSCSS=420P16";
      if (in_EDX == AOM_IMG_FMT_I42216) {
        local_48 = "C422p16 XYSCSS=422P16";
      }
    }
    local_8 = local_48;
  }
  return local_8;
}

Assistant:

static const char *colorspace(unsigned int bit_depth,
                              aom_chroma_sample_position_t csp,
                              aom_img_fmt_t fmt) {
  switch (bit_depth) {
    case 8: return colorspace8(csp, fmt);
    case 9:
      return fmt == AOM_IMG_FMT_I44416   ? "C444p9 XYSCSS=444P9"
             : fmt == AOM_IMG_FMT_I42216 ? "C422p9 XYSCSS=422P9"
                                         : "C420p9 XYSCSS=420P9";
    case 10:
      return fmt == AOM_IMG_FMT_I44416   ? "C444p10 XYSCSS=444P10"
             : fmt == AOM_IMG_FMT_I42216 ? "C422p10 XYSCSS=422P10"
                                         : "C420p10 XYSCSS=420P10";
    case 12:
      return fmt == AOM_IMG_FMT_I44416   ? "C444p12 XYSCSS=444P12"
             : fmt == AOM_IMG_FMT_I42216 ? "C422p12 XYSCSS=422P12"
                                         : "C420p12 XYSCSS=420P12";
    case 14:
      return fmt == AOM_IMG_FMT_I44416   ? "C444p14 XYSCSS=444P14"
             : fmt == AOM_IMG_FMT_I42216 ? "C422p14 XYSCSS=422P14"
                                         : "C420p14 XYSCSS=420P14";
    case 16:
      return fmt == AOM_IMG_FMT_I44416   ? "C444p16 XYSCSS=444P16"
             : fmt == AOM_IMG_FMT_I42216 ? "C422p16 XYSCSS=422P16"
                                         : "C420p16 XYSCSS=420P16";
    default: assert(0); return NULL;
  }
}